

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall duckdb::HashJoinFinalizeEvent::Schedule(HashJoinFinalizeEvent *this)

{
  bool bVar1;
  Pipeline *this_00;
  type pJVar2;
  type this_01;
  HashJoinFinalizeTask *pHVar3;
  long lVar4;
  bool local_b1;
  _Head_base<0UL,_duckdb::HashJoinFinalizeTask_*,_false> local_b0;
  long *local_a8;
  ClientContext *local_a0;
  enable_shared_from_this<duckdb::Event> local_98;
  shared_ptr<duckdb::Task,_true> local_88;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> finalize_tasks;
  unsigned_long chunk_idx_to;
  enable_shared_from_this<duckdb::Event> *local_58;
  idx_t chunk_count;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->
                      (&(this->super_BasePipelineEvent).pipeline);
  local_a0 = Pipeline::GetClientContext(this_00);
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator*(&this->sink->hash_table);
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(&pJVar2->data_collection);
  pHVar3 = (HashJoinFinalizeTask *)TupleDataCollection::ChunkCount(this_01);
  chunk_count = (idx_t)pHVar3;
  bVar1 = FinalizeSingleThreaded(this->sink,true);
  if (bVar1) {
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_98);
    chunk_idx_to = chunk_idx_to & 0xffffffff00000000;
    local_a8 = (long *)((ulong)local_a8 & 0xffffffffffffff00);
    make_uniq<duckdb::HashJoinFinalizeTask,duckdb::shared_ptr<duckdb::Event,true>,duckdb::ClientContext&,duckdb::HashJoinGlobalSinkState&,unsigned_int,unsigned_long_const&,bool,duckdb::PhysicalHashJoin_const&>
              ((duckdb *)&local_b0,(shared_ptr<duckdb::Event,_true> *)&local_98,local_a0,this->sink,
               (uint *)&chunk_idx_to,&chunk_count,(bool *)&local_a8,this->sink->op);
    shared_ptr<duckdb::Task,_true>::
    shared_ptr<duckdb::HashJoinFinalizeTask,_std::default_delete<duckdb::HashJoinFinalizeTask>,_true,_0>
              (&local_88,
               (unique_ptr<duckdb::HashJoinFinalizeTask,_std::default_delete<duckdb::HashJoinFinalizeTask>,_true>
                *)&local_b0);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&finalize_tasks,&local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_88.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_b0._M_head_impl != (HashJoinFinalizeTask *)0x0) {
      (*((local_b0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
    }
    local_b0._M_head_impl = (HashJoinFinalizeTask *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_98.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    lVar4 = 0x40;
    if ((local_a0->config).verify_parallelism != false) {
      lVar4 = 1;
    }
    local_58 = &(this->super_BasePipelineEvent).super_Event.
                super_enable_shared_from_this<duckdb::Event>;
    for (local_b0._M_head_impl = (HashJoinFinalizeTask *)0x0; local_b0._M_head_impl < pHVar3;
        local_b0._M_head_impl =
             (HashJoinFinalizeTask *)
             ((long)&((local_b0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task + lVar4)) {
      chunk_idx_to = (long)&((local_b0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task +
                     lVar4;
      if (pHVar3 <= chunk_idx_to) {
        chunk_idx_to = (unsigned_long)pHVar3;
      }
      enable_shared_from_this<duckdb::Event>::shared_from_this(&local_98);
      local_b1 = true;
      make_uniq<duckdb::HashJoinFinalizeTask,duckdb::shared_ptr<duckdb::Event,true>,duckdb::ClientContext&,duckdb::HashJoinGlobalSinkState&,unsigned_long&,unsigned_long&,bool,duckdb::PhysicalHashJoin_const&>
                ((duckdb *)&local_a8,(shared_ptr<duckdb::Event,_true> *)&local_98,local_a0,
                 this->sink,(unsigned_long *)&local_b0,&chunk_idx_to,&local_b1,this->sink->op);
      shared_ptr<duckdb::Task,_true>::
      shared_ptr<duckdb::HashJoinFinalizeTask,_std::default_delete<duckdb::HashJoinFinalizeTask>,_true,_0>
                (&local_88,
                 (unique_ptr<duckdb::HashJoinFinalizeTask,_std::default_delete<duckdb::HashJoinFinalizeTask>,_true>
                  *)&local_a8);
      ::std::
      vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                  *)&finalize_tasks,&local_88);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_88.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (local_a8 != (long *)0x0) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_98.__weak_this_.internal.
                  super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       finalize_tasks.
       super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       finalize_tasks.
       super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       finalize_tasks.
       super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&finalize_tasks.
             super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
           );
  return;
}

Assistant:

void Schedule() override {
		auto &context = pipeline->GetClientContext();

		vector<shared_ptr<Task>> finalize_tasks;
		auto &ht = *sink.hash_table;
		const auto chunk_count = ht.GetDataCollection().ChunkCount();

		// if the keys are too skewed, we finalize single-threaded
		if (FinalizeSingleThreaded(sink, true)) {
			// Single-threaded finalize
			finalize_tasks.push_back(
			    make_uniq<HashJoinFinalizeTask>(shared_from_this(), context, sink, 0U, chunk_count, false, sink.op));
		} else {
			// Parallel finalize
			const idx_t chunks_per_task = context.config.verify_parallelism ? 1 : CHUNKS_PER_TASK;
			for (idx_t chunk_idx = 0; chunk_idx < chunk_count; chunk_idx += chunks_per_task) {
				auto chunk_idx_to = MinValue<idx_t>(chunk_idx + chunks_per_task, chunk_count);
				finalize_tasks.push_back(make_uniq<HashJoinFinalizeTask>(shared_from_this(), context, sink, chunk_idx,
				                                                         chunk_idx_to, true, sink.op));
			}
		}
		SetTasks(std::move(finalize_tasks));
	}